

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pvip_node.c
# Opt level: O3

pvip_t * pvip_new(void)

{
  int iVar1;
  long *plVar2;
  PVIP_category_t PVar3;
  pvip_t *ppVar4;
  pvip_arena *ppVar5;
  long *plVar6;
  pvip_t *extraout_RAX;
  undefined8 *puVar7;
  undefined8 *__ptr;
  long lVar8;
  undefined8 *puVar9;
  
  puVar7 = (undefined8 *)0x8;
  ppVar4 = (pvip_t *)malloc(8);
  if (ppVar4 != (pvip_t *)0x0) {
    ppVar5 = (pvip_arena *)calloc(1,0x6010);
    ppVar4->arena = ppVar5;
    return ppVar4;
  }
  pvip_new_cold_1();
  plVar2 = (long *)*puVar7;
  iVar1 = (int)plVar2[1];
  plVar6 = plVar2;
  if ((long)iVar1 == 0x400) {
    __ptr = (undefined8 *)0x6010;
    plVar6 = (long *)malloc(0x6010);
    if (plVar6 == (long *)0x0) {
      pvip_node_alloc_cold_1();
      puVar7 = (undefined8 *)*__ptr;
      while (puVar7 != (undefined8 *)0x0) {
        if (0 < *(int *)(puVar7 + 1)) {
          puVar9 = puVar7 + 4;
          lVar8 = 0;
          do {
            PVar3 = PVIP_node_category(*(PVIP_node_type_t *)(puVar9 + -2));
            if (PVar3 == PVIP_CATEGORY_STRING) {
              PVIP_string_destroy((PVIPString *)puVar9[-1]);
            }
            else if (PVar3 == PVIP_CATEGORY_CHILDREN) {
              free((void *)*puVar9);
            }
            lVar8 = lVar8 + 1;
            puVar9 = puVar9 + 3;
          } while (lVar8 < *(int *)(puVar7 + 1));
        }
        puVar9 = (undefined8 *)*puVar7;
        free(puVar7);
        puVar7 = puVar9;
      }
      free(__ptr);
      return extraout_RAX;
    }
    *plVar6 = (long)plVar2;
    *puVar7 = plVar6;
  }
  *(int *)(plVar6 + 1) = iVar1 + 1;
  return (pvip_t *)(plVar6 + (long)iVar1 * 3 + 2);
}

Assistant:

struct pvip_t* pvip_new() {
    pvip_t* pvip = malloc(sizeof(pvip_t));
    ALLOC_CHECK(pvip);
    pvip->arena = malloc(sizeof(struct pvip_arena));
    memset(pvip->arena, 0, sizeof(struct pvip_arena));
    return pvip;
}